

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall TCPTransmitter::TCPTransmitter(TCPTransmitter *this,string *ipaddr,int port)

{
  string sStack_38;
  
  Socket::Socket(&this->super_Socket,TCP);
  std::__cxx11::string::string((string *)&sStack_38,(string *)ipaddr);
  Socket::setRemoteSocket(&this->super_Socket,&sStack_38,port);
  std::__cxx11::string::~string((string *)&sStack_38);
  Socket::connectToRemote(&this->super_Socket);
  return;
}

Assistant:

TCPTransmitter::TCPTransmitter(const std::string ipaddr, int port) : Socket(Socket::type::TCP) {
  setRemoteSocket(ipaddr, port);
  setNOSIGPIPE();
  connectToRemote();
}